

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibraryinfo.cpp
# Opt level: O2

bool pathIsAbsolute(QString *path)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QFileSystemEntry local_50;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::startsWith(path,(QChar)0x3a,CaseSensitive);
  bVar2 = true;
  if (!bVar1) {
    QFileSystemEntry::QFileSystemEntry(&local_50,path);
    bVar2 = QFileSystemEntry::isAbsolute(&local_50);
    QFileSystemEntry::~QFileSystemEntry(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool pathIsAbsolute(const QString &path)
{
    using FromInternalPath = QFileSystemEntry::FromInternalPath;
    return path.startsWith(':'_L1) || QFileSystemEntry(path, FromInternalPath{}).isAbsolute();
}